

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-wizard.c
# Opt level: O1

object * wiz_create_object_from_artifact(artifact *art)

{
  object_kind *k;
  object *obj;
  
  if ((art->name != (char *)0x0) && (k = lookup_kind(art->tval,art->sval), k != (object_kind *)0x0))
  {
    obj = object_new();
    object_prep(obj,k,art->alloc_min,RANDOMISE);
    obj->artifact = art;
    copy_artifact_data(obj,art);
    mark_artifact_created(art,true);
    return obj;
  }
  return (object *)0x0;
}

Assistant:

static struct object *wiz_create_object_from_artifact(const struct artifact *art)
{
	struct object_kind *kind;
	struct object *obj;

	/* Ignore "empty" artifacts */
	if (!art->name) return NULL;

	/* Acquire the "kind" index */
	kind = lookup_kind(art->tval, art->sval);
	if (!kind) return NULL;

	/* Create the artifact */
	obj = object_new();
	object_prep(obj, kind, art->alloc_min, RANDOMISE);
	obj->artifact = art;
	copy_artifact_data(obj, art);

	mark_artifact_created(art, true);

	return obj;
}